

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O2

uint zvgReadDeviceID(ZvgID_s *devID)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint idLen;
  
  idLen = (uint)((ulong)in_RAX >> 0x20);
  uVar1 = zvgGetDeviceID(ZvgIO.mBfr,0x100,&idLen);
  if (((uVar1 == 0) && (uVar1 = zvgSetEcpMode(), uVar1 == 0)) &&
     (uVar1 = 0x1d, ZvgIO.mBfr._0_4_ == 0x3a47464d)) {
    uVar4 = (ulong)idLen;
    uVar7 = 0x14;
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      if ((ZvgIO.mBfr[lVar6 + 4] == ';') || (uVar4 <= lVar6 + 4U)) {
        uVar7 = (int)lVar6 + 4;
        break;
      }
      devID->mfg[lVar6] = ZvgIO.mBfr[lVar6 + 4];
    }
    devID->mfg[lVar6] = '\0';
    iVar2 = strncmp((char *)(ZvgIO.mBfr + (uVar7 + 3)),"CMD:",4);
    if (uVar7 + 3 < idLen && iVar2 == 0) {
      uVar5 = (ulong)uVar7 + 7;
      uVar8 = uVar7 + 0x17;
      for (lVar6 = 0x5b; lVar6 != 0x6b; lVar6 = lVar6 + 1) {
        if ((ZvgIO.mBfr[lVar6 + (ulong)uVar7 + -0x54] == ';') || (uVar4 <= uVar5)) {
          uVar8 = (uint)uVar5;
          break;
        }
        uVar5 = uVar5 + 1;
        devID->mfg[lVar6 + -0x4a] = ZvgIO.mBfr[lVar6 + (ulong)uVar7 + -0x54];
      }
      devID->mfg[lVar6 + -0x4a] = '\0';
      iVar2 = strncmp((char *)(ZvgIO.mBfr + (uVar8 + 3)),"MDL:",4);
      if (uVar8 + 3 < idLen && iVar2 == 0) {
        uVar5 = (ulong)uVar8 + 7;
        iVar2 = uVar8 + 0x17;
        for (lVar6 = 0x5b; lVar6 != 0x6b; lVar6 = lVar6 + 1) {
          if ((ZvgIO.mBfr[lVar6 + (ulong)uVar8 + -0x54] == ';') || (uVar4 <= uVar5)) {
            iVar2 = (int)uVar5;
            break;
          }
          uVar5 = uVar5 + 1;
          devID->mfg[lVar6 + -0x39] = ZvgIO.mBfr[lVar6 + (ulong)uVar8 + -0x54];
        }
        devID->mfg[lVar6 + -0x39] = '\0';
        iVar3 = strncmp((char *)(ZvgIO.mBfr + (iVar2 + 3U)),"VER:",4);
        if (iVar2 + 3U < idLen && iVar3 == 0) {
          uVar4 = strtoul((char *)(ZvgIO.mBfr + (iVar2 + 7)),(char **)0x0,0x10);
          devID->fVer = (uint)uVar4;
          if (iVar2 + 0xbU < idLen && ZvgIO.mBfr[iVar2 + 0xbU] == ',') {
            uVar4 = strtoul((char *)(ZvgIO.mBfr + (iVar2 + 0xc)),(char **)0x0,0x10);
            devID->bVer = (uint)uVar4;
            if (iVar2 + 0x10U < idLen && ZvgIO.mBfr[iVar2 + 0x10U] == ',') {
              uVar4 = strtoul((char *)(ZvgIO.mBfr + (iVar2 + 0x11)),(char **)0x0,0x10);
              devID->vVer = (uint)uVar4;
              if (((iVar2 + 0x15U < idLen && ZvgIO.mBfr[iVar2 + 0x15U] == ';') &&
                  (iVar3 = strncmp((char *)(ZvgIO.mBfr + (iVar2 + 0x18U)),"SWS:",4),
                  iVar2 + 0x18U < idLen)) && (iVar3 == 0)) {
                uVar4 = strtoul((char *)(ZvgIO.mBfr + (iVar2 + 0x1c)),(char **)0x0,0x10);
                devID->sws = (uint)uVar4;
                if (((iVar2 + 0x1eU < idLen && ZvgIO.mBfr[iVar2 + 0x1eU] == ';') &&
                    (iVar3 = strncmp((char *)(ZvgIO.mBfr + (iVar2 + 0x21U)),"ESB:",4),
                    iVar2 + 0x21U < idLen)) && (iVar3 == 0)) {
                  uVar4 = strtoul((char *)(ZvgIO.mBfr + (iVar2 + 0x25)),(char **)0x0,0x10);
                  devID->fESB = (uint)uVar4;
                  if (iVar2 + 0x29U < idLen && ZvgIO.mBfr[iVar2 + 0x29U] == ',') {
                    uVar4 = strtoul((char *)(ZvgIO.mBfr + (iVar2 + 0x2a)),(char **)0x0,0x10);
                    devID->vESB = (uint)uVar4;
                    uVar1 = 0;
                    if (idLen <= iVar2 + 0x2eU) {
                      uVar1 = 0x1d;
                    }
                    if (ZvgIO.mBfr[iVar2 + 0x2eU] != ';') {
                      uVar1 = 0x1d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar1;
}

Assistant:

uint zvgReadDeviceID( ZvgID_s *devID)
{
	uint	idLen, err, ii, jj;

	err = zvgGetDeviceID( ZvgIO.mBfr, ZVG_MAX_BFRSZ, &idLen);

	if (err)
		return (err);

	// return to ECP mode

	err = zvgSetEcpMode();

	if (err)
		return (err);

	// parse buffer

	ii = 0;

	// Get "MFG:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "MFG:", 4) != 0)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->mfg[jj++] = ZvgIO.mBfr[ii++];

	devID->mfg[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "CMD:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "CMD:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->cmd[jj++] = ZvgIO.mBfr[ii++];

	devID->cmd[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "MDL:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "MDL:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->mdl[jj++] = ZvgIO.mBfr[ii++];

	devID->mdl[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "VER:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "VER:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	devID->fVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->bVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->vVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	ii += 3;						// skip ';',CR,LF

	// Get "SWS:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "SWS:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;
	devID->sws = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 2;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	ii += 3;						// skip ';',CR,LF

	// Get "ESB:" (Error Status Bits)

	if (strncmp( (char*)ZvgIO.mBfr + ii, "ESB:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;
	devID->fESB = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->vESB = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	return (err);
}